

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O1

int ON_Intersect(ON_Line *line,ON_Arc *arc,double *line_t0,ON_3dPoint *arc_point0,double *line_t1,
                ON_3dPoint *arc_point1)

{
  ON_3dPoint *pOVar1;
  ON_3dPoint *pOVar2;
  bool bVar3;
  uint uVar4;
  double *pdVar5;
  uint uVar6;
  long lVar7;
  double *pdVar8;
  undefined2 *puVar9;
  ON_3dPoint *circle_point0;
  double dVar10;
  bool b [2];
  double t [2];
  ON_3dPoint q;
  double a [2];
  ON_Interval arc_domain;
  ON_3dPoint p [2];
  ON_Circle c;
  undefined2 local_16a;
  double local_168 [3];
  ON_Line *local_150;
  uint local_144;
  ON_3dPoint local_140;
  double local_128 [2];
  ON_3dPoint *local_118;
  double *local_110;
  double *local_108;
  ON_3dPoint *local_100;
  ON_Interval local_f8;
  ON_3dPoint local_e8;
  ON_3dPoint local_d0;
  ON_Circle local_b8;
  
  local_108 = line_t0;
  local_100 = arc_point1;
  memcpy(&local_b8,arc,0x88);
  local_16a = 0;
  circle_point0 = &local_e8;
  local_150 = line;
  uVar4 = ON_Intersect(line,&local_b8,local_168,circle_point0,local_168 + 1,&local_d0);
  if (0 < (int)uVar4) {
    local_118 = arc_point0;
    local_110 = line_t1;
    local_f8 = ON_Arc::DomainRadians(arc);
    puVar9 = &local_16a;
    lVar7 = 0;
    local_144 = uVar4;
    do {
      pdVar8 = (double *)((long)local_128 + lVar7);
      bVar3 = ON_Circle::ClosestPointTo(&local_b8,circle_point0,pdVar8);
      *(bool *)puVar9 = bVar3;
      if (bVar3) {
        dVar10 = ON_Interval::NormalizedParameterAt(&local_f8,*pdVar8);
        if (0.0 <= dVar10) {
          if (dVar10 <= 1.0) goto LAB_004bfe9a;
          if (1.0000000149011612 < dVar10) goto LAB_004bfe41;
          pdVar5 = ON_Interval::operator[](&local_f8,1);
          dVar10 = *pdVar5;
          *pdVar8 = dVar10;
          ON_Circle::PointAt(&local_140,&local_b8,dVar10);
          circle_point0->z = local_140.z;
          circle_point0->x = local_140.x;
          circle_point0->y = local_140.y;
          bVar3 = ON_Line::ClosestPointTo
                            (local_150,circle_point0,(double *)((long)local_168 + lVar7));
        }
        else if (dVar10 < -1.490116119385e-08) {
LAB_004bfe41:
          bVar3 = false;
        }
        else {
          pdVar5 = ON_Interval::operator[](&local_f8,0);
          dVar10 = *pdVar5;
          *pdVar8 = dVar10;
          ON_Circle::PointAt(&local_140,&local_b8,dVar10);
          circle_point0->z = local_140.z;
          circle_point0->x = local_140.x;
          circle_point0->y = local_140.y;
          bVar3 = ON_Line::ClosestPointTo
                            (local_150,circle_point0,(double *)((long)local_168 + lVar7));
        }
        *(bool *)puVar9 = bVar3;
      }
LAB_004bfe9a:
      pOVar2 = local_100;
      pdVar8 = local_110;
      pOVar1 = local_118;
      lVar7 = lVar7 + 8;
      puVar9 = (undefined2 *)((long)puVar9 + 1);
      circle_point0 = circle_point0 + 1;
    } while ((ulong)uVar4 << 3 != lVar7);
    uVar6 = 0;
    if ((((byte)local_16a | local_16a._1_1_) & 1) != 0) {
      uVar6 = local_144;
    }
    if (uVar6 == 2) {
      if ((byte)local_16a == 0) {
        local_168[0] = local_168[1];
        local_128[0] = local_128[1];
        local_e8.x = local_d0.x;
        local_e8.y = local_d0.y;
        local_e8.z = local_d0.z;
        local_16a = (ushort)local_16a._1_1_;
        uVar6 = 1;
      }
      else {
        uVar6 = 1;
        if ((local_16a & 0x100) != 0) {
          if ((local_168[0] != local_168[1]) || (NAN(local_168[0]) || NAN(local_168[1]))) {
            uVar6 = 2;
          }
          else {
            local_16a = local_16a & 0xff;
            ON_Line::PointAt(&local_140,local_150,local_168[0]);
            local_150 = (ON_Line *)ON_3dPoint::DistanceTo(&local_e8,&local_140);
            dVar10 = ON_3dPoint::DistanceTo(&local_d0,&local_140);
            if (dVar10 < (double)local_150) {
              local_128[0] = local_128[1];
              local_168[0] = local_168[1];
              local_e8.x = local_d0.x;
              local_e8.y = local_d0.y;
              local_e8.z = local_d0.z;
            }
          }
        }
      }
    }
    uVar4 = (uint)(byte)local_16a;
    if (uVar6 != 1) {
      uVar4 = uVar6;
    }
    if (0 < (int)uVar4) {
      if (local_108 != (double *)0x0) {
        *local_108 = local_168[0];
      }
      pOVar1->z = local_e8.z;
      pOVar1->x = local_e8.x;
      pOVar1->y = local_e8.y;
    }
    if (uVar4 == 2) {
      if (pdVar8 != (double *)0x0) {
        *pdVar8 = local_168[1];
      }
      pOVar2->z = local_d0.z;
      pOVar2->x = local_d0.x;
      pOVar2->y = local_d0.y;
    }
  }
  ON_Plane::~ON_Plane(&local_b8.plane);
  return uVar4;
}

Assistant:

int ON_Intersect(
      const ON_Line& line, 
      const ON_Arc& arc,
      double* line_t0,
      ON_3dPoint& arc_point0,
      double* line_t1,
      ON_3dPoint& arc_point1
      )
{
  // RH-48633 In V7 and earlier there were cases where 1 was returned and the 
  // returned arc_point0 is the closest point on the arc to the line but not an
  // intersection point
  ON_Circle c = arc;
  ON_3dPoint p[2];
  double t[2], a[2], s;
  bool b[2] = {false,false};
  int i, xcnt = ON_Intersect( line, c, &t[0], p[0], &t[1], p[1] );
 
  if ( xcnt > 0 )
  {
    // make sure points are on the arc;
    ON_Interval arc_domain = arc.DomainRadians();
    for ( i = 0; i < xcnt; i++ )
    {
      b[i] = c.ClosestPointTo(p[i], &a[i]);
      if ( b[i] )
      {
        s = arc_domain.NormalizedParameterAt(a[i]);
        if ( s < 0.0 )
        {
          if ( s >= -ON_SQRT_EPSILON )
          {
            a[i] = arc_domain[0];
            p[i] = c.PointAt(a[i]);
            b[i] = line.ClosestPointTo( p[i], &t[i] );
          }
          else
            b[i] = false;
        }
        else if ( s > 1.0 )
        {
          if ( s <= 1.0+ON_SQRT_EPSILON )
          {
            a[i] = arc_domain[1];
            p[i] = c.PointAt(a[i]);
            b[i] = line.ClosestPointTo( p[i], &t[i] );
          }
          else
            b[i] = false;
        }
      }
    }
    if ( !b[0] && !b[1] )
      xcnt = 0;

    if ( xcnt == 2 )
    {
      if ( !b[1] )
        xcnt = 1;
      if ( !b[0] )
      {
        xcnt = 1;
        b[0] = b[1];
        t[0] = t[1];
        a[0] = a[1];
        p[0] = p[1];
        b[1] = 0;
      }
      if ( xcnt == 2 && t[0] == t[1] )
      {
        xcnt = 1;
        b[1] = 0;
        ON_3dPoint q = line.PointAt(t[0]);
        if ( p[0].DistanceTo(q) > p[1].DistanceTo(q) )
        {
          a[0] = a[1];
          t[0] = t[1];
          p[0] = p[1];
        }
      }
    }
    if  ( xcnt == 1 && !b[0] )
      xcnt = 0;
    if ( xcnt >= 1 )
    {
      if ( line_t0 )
        *line_t0 = t[0];
      arc_point0 = p[0];
    }
    if ( xcnt == 2 )
    {
      if ( line_t1 )
        *line_t1 = t[1];
      arc_point1 = p[1];
    }
  }
  return xcnt;
}